

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::LocalStructTests::init()::Eval_nested_struct_array::eval(deqp::ShaderEvalContext__
               (ShaderEvalContext *c)

{
  long lVar1;
  float afStack_2c [5];
  int aiStack_18 [6];
  
  afStack_2c[2] = (c->coords).m_data[2];
  afStack_2c[3] = (c->coords).m_data[0];
  afStack_2c[4] = (c->coords).m_data[3];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar1]] = afStack_2c[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }